

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void remove_expired(CookieInfo *cookies)

{
  long lVar1;
  time_t tVar2;
  Cookie *pCVar3;
  Cookie *co;
  Cookie *pCVar4;
  long lVar5;
  bool bVar6;
  
  tVar2 = time((time_t *)0x0);
  if (cookies->next_expiration <= tVar2 || cookies->next_expiration == 0x7fffffffffffffff) {
    cookies->next_expiration = 0x7fffffffffffffff;
    lVar5 = 0;
LAB_004e04b2:
    if (lVar5 != 0x100) {
      pCVar4 = ((Cookie *)(cookies->cookies + lVar5))->next;
      co = (Cookie *)0x0;
      do {
        bVar6 = co == (Cookie *)0x0;
        pCVar3 = co;
        co = pCVar4;
        if (bVar6) {
          pCVar3 = (Cookie *)(cookies->cookies + lVar5);
        }
        while( true ) {
          if (co == (Cookie *)0x0) {
            lVar5 = lVar5 + 1;
            goto LAB_004e04b2;
          }
          pCVar4 = co->next;
          lVar1 = co->expires;
          if ((lVar1 == 0) || (tVar2 <= lVar1)) break;
          pCVar3->next = pCVar4;
          cookies->numcookies = cookies->numcookies + -1;
          freecookie(co);
          co = pCVar4;
        }
        if ((lVar1 != 0) && (lVar1 < cookies->next_expiration)) {
          cookies->next_expiration = lVar1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static void remove_expired(struct CookieInfo *cookies)
{
  struct Cookie *co, *nx;
  curl_off_t now = (curl_off_t)time(NULL);
  unsigned int i;

  /*
   * If the earliest expiration timestamp in the jar is in the future we can
   * skip scanning the whole jar and instead exit early as there won't be any
   * cookies to evict.  If we need to evict however, reset the next_expiration
   * counter in order to track the next one. In case the recorded first
   * expiration is the max offset, then perform the safe fallback of checking
   * all cookies.
   */
  if(now < cookies->next_expiration &&
      cookies->next_expiration != CURL_OFF_T_MAX)
    return;
  else
    cookies->next_expiration = CURL_OFF_T_MAX;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Cookie *pv = NULL;
    co = cookies->cookies[i];
    while(co) {
      nx = co->next;
      if(co->expires && co->expires < now) {
        if(!pv) {
          cookies->cookies[i] = co->next;
        }
        else {
          pv->next = co->next;
        }
        cookies->numcookies--;
        freecookie(co);
      }
      else {
        /*
         * If this cookie has an expiration timestamp earlier than what we've
         * seen so far then record it for the next round of expirations.
         */
        if(co->expires && co->expires < cookies->next_expiration)
          cookies->next_expiration = co->expires;
        pv = co;
      }
      co = nx;
    }
  }
}